

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O3

PrgBody * Clasp::Asp::PrgBody::create(LogicProgram *prg,uint32 id,Rule *r,uint32 pos,bool addDeps)

{
  uint uVar1;
  PrgBody *this;
  PrgNode PVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  lVar5 = (r->field_3).cond.size * 4;
  if ((r->bt).val_ == Normal) {
    this = (PrgBody *)operator_new(lVar5 + 0x18);
    PrgBody(this,id,prg,&(r->field_3).cond,pos,addDeps);
    uVar1 = *(uint *)&this->field_0x8;
  }
  else {
    this = (PrgBody *)operator_new(lVar5 + 0x20);
    PrgBody(this,id,prg,&(r->field_3).agg,(r->bt).val_ == Sum,pos,addDeps);
    uVar1 = *(uint *)&this->field_0x8;
    uVar4 = uVar1 & 0x18000000;
    if (uVar4 == 0x8000000) {
      PVar2 = this[1].super_PrgNode;
      iVar3 = *(int *)PVar2;
      if (iVar3 < 1) goto LAB_0014bbc0;
LAB_0014bb5d:
      uVar4 = *(uint *)((long)PVar2 + 4);
    }
    else {
      if ((uVar4 == 0) || (iVar3 = *(int *)&this[1].super_PrgNode, iVar3 < 1)) goto LAB_0014bbc0;
      if (uVar4 == 0x8000000) {
        PVar2 = this[1].super_PrgNode;
        iVar3 = *(int *)PVar2;
        goto LAB_0014bb5d;
      }
      if (uVar4 == 0) goto LAB_0014bbc0;
      uVar4 = uVar1 & 0x1ffffff;
    }
    if ((int)uVar4 <= iVar3) {
LAB_0014bbc0:
      Potassco::fail(-2,
                     "static PrgBody *Clasp::Asp::PrgBody::create(LogicProgram &, uint32, const Rule &, uint32, bool)"
                     ,0x2cf,"ret->bound() > 0 && ret->sumW() > ret->bound()","body not simplified",0
                    );
    }
  }
  if ((uVar1 & 0x18000000) == 0x8000000) {
    PVar2 = this[1].super_PrgNode;
  }
  else {
    if ((uVar1 & 0x18000000) == 0) {
      uVar1 = uVar1 & 0x1ffffff;
      goto LAB_0014bb99;
    }
    PVar2 = (PrgNode)(this + 1);
  }
  uVar1 = *(uint *)PVar2;
LAB_0014bb99:
  if (uVar1 == 0) {
    assignValue(this,'\x01');
    this->field_0xb = this->field_0xb | 0x20;
  }
  return this;
}

Assistant:

PrgBody* PrgBody::create(LogicProgram& prg, uint32 id, const Rule& r, uint32 pos, bool addDeps) {
	static_assert(sizeof(PrgBody) == 24 && sizeof(Agg) == sizeof(void*), "unexpected alignment");
	PrgBody* ret = 0;
	if (r.normal()) {
		size_t bytes = sizeof(PrgBody) + (Potassco::size(r.cond) * sizeof(Literal));
		ret = new (::operator new(bytes)) PrgBody(id, prg, r.cond, pos, addDeps);
	}
	else {
		const Potassco::Sum_t& sum = r.agg;
		size_t bytes = sizeof(PrgBody) + (Potassco::size(r.agg.lits) * sizeof(Literal)) + sizeof(Agg);
		ret = new (::operator new(bytes)) PrgBody(id, prg, sum, r.bt == Body_t::Sum, pos, addDeps);
		POTASSCO_REQUIRE(ret->bound() > 0 && ret->sumW() > ret->bound(), "body not simplified");
	}
	if (ret->bound() == 0) {
		ret->assignValue(value_true);
		ret->markDirty();
	}
	return ret;
}